

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O2

uint32_t __thiscall
level_mesh::instantiate_mu_model(level_mesh *this,uint16_t model_id,uint16_t sector,fmatrix *xform)

{
  uint32_t uVar1;
  b_mu_instance local_4c;
  
  local_4c.xform.field_0._0_8_ = *(undefined8 *)&xform->field_0;
  local_4c.xform.field_0._8_8_ = *(undefined8 *)((long)&xform->field_0 + 8);
  local_4c.xform.field_0._16_8_ = *(undefined8 *)((long)&xform->field_0 + 0x10);
  local_4c.xform.field_0._24_8_ = *(undefined8 *)((long)&xform->field_0 + 0x18);
  local_4c.xform.field_0._32_8_ = *(undefined8 *)((long)&xform->field_0 + 0x20);
  local_4c.xform.field_0._40_8_ = *(undefined8 *)((long)&xform->field_0 + 0x28);
  local_4c.xform.field_0._48_8_ = *(undefined8 *)((long)&xform->field_0 + 0x30);
  local_4c.xform.field_0._56_8_ = *(undefined8 *)((long)&xform->field_0 + 0x38);
  local_4c.model_id = model_id;
  local_4c.sector = sector;
  std::vector<b_mu_instance,_std::allocator<b_mu_instance>_>::emplace_back<b_mu_instance>
            (&this->m_mu_instances,&local_4c);
  uVar1 = this->m_free_tag;
  this->m_free_tag = uVar1 + 1;
  return uVar1;
}

Assistant:

uint32_t level_mesh::instantiate_mu_model(uint16_t model_id, uint16_t sector, const fmatrix& xform)
{
	m_mu_instances.push_back(b_mu_instance(model_id, sector, xform));
	return m_free_tag++;
}